

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  ulong uVar2;
  byte bVar3;
  element_type *peVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  location first;
  source_location src;
  source_location prefix_src;
  string local_2e8;
  string local_2c8;
  location local_2a8;
  undefined1 local_260 [48];
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  _Alloc_hider local_220;
  size_t local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  pointer local_200;
  pointer pbStack_1f8;
  pointer local_1f0;
  element_type *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  _Alloc_hider local_1a8;
  size_t local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  pointer pbStack_180;
  pointer local_178;
  region local_168;
  source_location local_100;
  failure<toml::error_info> local_88;
  
  location::location(&local_2a8,loc);
  psVar1 = &loc->location_;
  peVar4 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar7 = loc->location_;
  lVar5 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar5;
  if ((uVar7 < uVar6) && ((*(char *)(lVar5 + uVar7) == '-' || (*(char *)(lVar5 + uVar7) == '+')))) {
    if (uVar7 + 1 < uVar6) {
      loc->column_number_ = loc->column_number_ + 1;
      uVar2 = uVar7 + 1;
    }
    else {
      sVar8 = loc->line_number_;
      sVar9 = loc->column_number_;
      do {
        if (*(char *)(lVar5 + uVar7) == '\n') {
          sVar8 = sVar8 + 1;
          loc->line_number_ = sVar8;
          sVar9 = 1;
        }
        else {
          sVar9 = sVar9 + 1;
        }
        loc->column_number_ = sVar9;
        uVar7 = uVar7 + 1;
        uVar2 = uVar6;
      } while (uVar6 != uVar7);
    }
    uVar7 = uVar2;
    *psVar1 = uVar7;
  }
  if ((uVar7 < uVar6) && (*(char *)(lVar5 + uVar7) == '0')) {
    uVar2 = uVar7 + 1;
    if (uVar2 < uVar6) {
      loc->column_number_ = loc->column_number_ + 1;
      loc->location_ = uVar2;
      bVar3 = *(byte *)(lVar5 + uVar2);
      region::region((region *)local_260,loc);
      source_location::source_location(&local_100,(region *)local_260);
      region::~region((region *)local_260);
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_2a8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_2a8.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&loc->source_name_,&local_2a8.source_name_);
      loc->column_number_ = local_2a8.column_number_;
      *psVar1 = local_2a8.location_;
      loc->line_number_ = local_2a8.line_number_;
      if (bVar3 == 0x78) {
        parse_hex_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else if (bVar3 == 0x6f) {
        parse_oct_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else if (bVar3 == 0x62) {
        parse_bin_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
      }
      else {
        if (9 < bVar3 - 0x30) {
          source_location::~source_location(&local_100);
          goto LAB_003776c4;
        }
        region::region(&local_168,loc);
        source_location::source_location((source_location *)local_260,&local_168);
        region::~region(&local_168);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2c8,
                   "toml::parse_integer: leading zero in an decimal integer is not allowed","");
        local_1a8._M_p = (pointer)&local_198;
        local_1b8 = local_230;
        uStack_1b4 = uStack_22c;
        uStack_1b0 = uStack_228;
        uStack_1ac = uStack_224;
        local_1c8 = local_260._32_4_;
        uStack_1c4 = local_260._36_4_;
        uStack_1c0 = local_260._40_4_;
        uStack_1bc = local_260._44_4_;
        local_1d8 = local_260._16_4_;
        uStack_1d4 = local_260._20_4_;
        uStack_1d0 = local_260._24_4_;
        uStack_1cc = local_260._28_4_;
        local_1e8 = (element_type *)local_260._0_8_;
        p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_p == &local_210) {
          local_198._8_8_ = local_210._8_8_;
        }
        else {
          local_1a8._M_p = local_220._M_p;
        }
        local_1a0 = local_218;
        local_218 = 0;
        local_210._M_local_buf[0] = '\0';
        local_188 = local_200;
        pbStack_180 = pbStack_1f8;
        local_178 = local_1f0;
        local_200 = (pointer)0x0;
        pbStack_1f8 = (pointer)0x0;
        local_1f0 = (pointer)0x0;
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        local_220._M_p = (pointer)&local_210;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"leading zero","");
        make_error_info<>((error_info *)&local_168,&local_2c8,(source_location *)&local_1e8,
                          &local_2e8);
        err<toml::error_info>(&local_88,(error_info *)&local_168);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
        failure<toml::error_info>::~failure(&local_88);
        error_info::~error_info((error_info *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)local_260);
      }
      source_location::~source_location(&local_100);
      goto LAB_0037770c;
    }
    sVar8 = loc->line_number_;
    sVar9 = loc->column_number_;
    do {
      if (*(char *)(lVar5 + uVar7) == '\n') {
        sVar8 = sVar8 + 1;
        loc->line_number_ = sVar8;
        sVar9 = 1;
      }
      else {
        sVar9 = sVar9 + 1;
      }
      loc->column_number_ = sVar9;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    *psVar1 = uVar6;
  }
LAB_003776c4:
  (loc->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_2a8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(loc->source_).
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &local_2a8.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&loc->source_name_,&local_2a8.source_name_);
  loc->column_number_ = local_2a8.column_number_;
  *psVar1 = local_2a8.location_;
  loc->line_number_ = local_2a8.line_number_;
  parse_dec_integer<toml::type_config>(__return_storage_ptr__,loc,ctx);
LAB_0037770c:
  location::~location(&local_2a8);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && (loc.current() == '+' || loc.current() == '-'))
    {
        // skip +/- to diagnose +0xDEADBEEF or -0b0011 (invalid).
        // without this, +0xDEAD_BEEF will be parsed as a decimal int and
        // unexpected "xDEAD_BEEF" will appear after integer "+0".
        loc.advance();
    }

    if( ! loc.eof() && loc.current() == '0')
    {
        loc.advance();
        if(loc.eof())
        {
            // `[+-]?0`. parse as an decimal integer.
            loc = first;
            return parse_dec_integer(loc, ctx);
        }

        const auto prefix = loc.current();
        auto prefix_src = source_location(region(loc));

        loc = first;

        if(prefix == 'b') {return parse_bin_integer(loc, ctx);}
        if(prefix == 'o') {return parse_oct_integer(loc, ctx);}
        if(prefix == 'x') {return parse_hex_integer(loc, ctx);}

        if(std::isdigit(prefix))
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_integer: "
                "leading zero in an decimal integer is not allowed",
                std::move(src), "leading zero"));
        }
    }

    loc = first;
    return parse_dec_integer(loc, ctx);
}